

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

FaceIter __thiscall CMU462::HalfedgeMesh::bevelFace(HalfedgeMesh *this,FaceIter f)

{
  double dVar1;
  bool bVar2;
  Size SVar3;
  pointer pFVar4;
  HalfedgeIter *pHVar5;
  pointer pHVar6;
  pointer pVVar7;
  pointer pVVar8;
  reference pvVar9;
  reference pvVar10;
  VertexIter *pVVar11;
  reference pvVar12;
  FaceIter *pFVar13;
  reference pvVar14;
  EdgeIter *pEVar15;
  pointer pEVar16;
  int iVar17;
  int iVar18;
  _List_node_base *in_RSI;
  int i_1;
  int i_minus_1;
  int i_plus_1;
  int i;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  inside_twin_halfedge;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  inside_halfedge;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  inward_halfedge;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  outward_halfedge;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  new_vertex;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  connectingEdge;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  innerEdge;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  sideFace;
  HalfedgeIter h;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  old_halfedge;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  old_vertex;
  int n;
  FaceIter new_face;
  value_type *in_stack_fffffffffffffc38;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  *in_stack_fffffffffffffc40;
  value_type *in_stack_fffffffffffffc48;
  Face *in_stack_fffffffffffffc50;
  HalfedgeMesh *in_stack_fffffffffffffca8;
  HalfedgeMesh *in_stack_fffffffffffffcd8;
  HalfedgeMesh *in_stack_fffffffffffffd28;
  HalfedgeMesh *in_stack_fffffffffffffd78;
  int local_17c;
  int local_12c;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_128;
  undefined1 local_110 [72];
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  local_c8;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_b0;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_98;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  local_80;
  _Self local_58;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_50;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  local_38;
  int local_1c;
  _List_node_base *local_10;
  _List_node_base *local_8;
  
  local_10 = in_RSI;
  std::_List_iterator<CMU462::Face>::operator->
            ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffc40);
  SVar3 = Face::degree(in_stack_fffffffffffffc50);
  local_1c = (int)SVar3;
  std::
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
            *)0x246808);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)0x246815);
  pFVar4 = std::_List_iterator<CMU462::Face>::operator->
                     ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffc40);
  pHVar5 = Face::halfedge(pFVar4);
  local_58._M_node = pHVar5->_M_node;
  do {
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    Halfedge::vertex(pHVar6);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)in_stack_fffffffffffffc50,(value_type *)in_stack_fffffffffffffc48);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pHVar5 = Halfedge::next(pHVar6);
    local_58._M_node = pHVar5->_M_node;
    pFVar4 = std::_List_iterator<CMU462::Face>::operator->
                       ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffc40);
    pHVar5 = Face::halfedge(pFVar4);
    bVar2 = std::operator!=(&local_58,pHVar5);
  } while (bVar2);
  local_8 = local_10;
  std::
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
  vector((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
          *)0x24691f);
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  vector((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
          *)0x24692c);
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  vector((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
          *)0x246939);
  std::
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
            *)0x246946);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)0x246953);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)0x246960);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)0x24696d);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)0x24697a);
  for (local_12c = 0; local_12c < local_1c; local_12c = local_12c + 1) {
    newFace(in_stack_fffffffffffffd28);
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    newEdge(in_stack_fffffffffffffcd8);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    push_back(in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    newEdge(in_stack_fffffffffffffcd8);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    push_back(in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    newVertex(in_stack_fffffffffffffd78);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    newHalfedge(in_stack_fffffffffffffca8);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    newHalfedge(in_stack_fffffffffffffca8);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    newHalfedge(in_stack_fffffffffffffca8);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    newHalfedge(in_stack_fffffffffffffca8);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
  }
  for (local_17c = 0; local_17c < local_1c; local_17c = local_17c + 1) {
    iVar17 = (local_17c + 1) % local_1c;
    iVar18 = (local_17c + -1 + local_1c) % local_1c;
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::operator[](&local_38,(long)local_17c);
    pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffc40);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::operator[](&local_c8,(long)local_17c);
    pVVar8 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffc40);
    (pVVar8->position).z = (pVVar7->position).z;
    dVar1 = (pVVar7->position).y;
    (pVVar8->position).x = (pVVar7->position).x;
    (pVVar8->position).y = dVar1;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           *)(local_110 + 0x18),(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::operator[](&local_38,(long)local_17c);
    pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffc40);
    pHVar5 = Vertex::halfedge(pVVar7);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar10 = std::
              vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
              ::operator[](&local_38,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)(local_110 + 0x18),(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pVVar11 = Halfedge::vertex(pHVar6);
    pVVar11->_M_node = pvVar10->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           *)(local_110 + 0x30),(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::operator[](&local_c8,(long)local_17c);
    pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffc40);
    pHVar5 = Vertex::halfedge(pVVar7);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar10 = std::
              vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
              ::operator[](&local_c8,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)(local_110 + 0x30),(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pVVar11 = Halfedge::vertex(pHVar6);
    pVVar11->_M_node = pvVar10->_M_node;
    pvVar10 = std::
              vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
              ::operator[](&local_c8,(long)iVar17);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[](&local_128,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pVVar11 = Halfedge::vertex(pHVar6);
    pVVar11->_M_node = pvVar10->_M_node;
    pvVar10 = std::
              vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
              ::operator[](&local_c8,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)local_110,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pVVar11 = Halfedge::vertex(pHVar6);
    pVVar11->_M_node = pvVar10->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           *)(local_110 + 0x18),(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)(local_110 + 0x30),(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pHVar5 = Halfedge::twin(pHVar6);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           *)(local_110 + 0x30),(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)(local_110 + 0x18),(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pHVar5 = Halfedge::twin(pHVar6);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[](&local_128,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)local_110,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pHVar5 = Halfedge::twin(pHVar6);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           *)local_110,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[](&local_128,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pHVar5 = Halfedge::twin(pHVar6);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar12 = std::
              vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
              ::operator[](&local_80,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)(local_110 + 0x30),(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pFVar13 = Halfedge::face(pHVar6);
    pFVar13->_M_node = pvVar12->_M_node;
    pvVar12 = std::
              vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
              ::operator[](&local_80,(long)iVar18);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)(local_110 + 0x18),(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pFVar13 = Halfedge::face(pHVar6);
    pFVar13->_M_node = pvVar12->_M_node;
    pvVar12 = std::
              vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
              ::operator[](&local_80,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[](&local_128,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pFVar13 = Halfedge::face(pHVar6);
    pFVar13->_M_node = pvVar12->_M_node;
    pvVar12 = std::
              vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
              ::operator[](&local_80,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[](&local_50,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pFVar13 = Halfedge::face(pHVar6);
    pFVar13->_M_node = pvVar12->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[](&local_50,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    operator[](&local_80,(long)local_17c);
    pFVar4 = std::_List_iterator<CMU462::Face>::operator->
                       ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffc40);
    pHVar5 = Face::halfedge(pFVar4);
    pHVar5->_M_node = pvVar9->_M_node;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)local_110,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pFVar13 = Halfedge::face(pHVar6);
    pFVar13->_M_node = local_8;
    pvVar14 = std::
              vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
              ::operator[](&local_98,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)local_110,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pEVar15 = Halfedge::edge(pHVar6);
    pEVar15->_M_node = pvVar14->_M_node;
    pvVar14 = std::
              vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
              ::operator[](&local_98,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[](&local_128,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pEVar15 = Halfedge::edge(pHVar6);
    pEVar15->_M_node = pvVar14->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           *)local_110,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    operator[](&local_98,(long)local_17c);
    pEVar16 = std::_List_iterator<CMU462::Edge>::operator->
                        ((_List_iterator<CMU462::Edge> *)0x2473f4);
    pHVar5 = Edge::halfedge(pEVar16);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar14 = std::
              vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
              ::operator[](&local_b0,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)(local_110 + 0x30),(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pEVar15 = Halfedge::edge(pHVar6);
    pEVar15->_M_node = pvVar14->_M_node;
    pvVar14 = std::
              vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
              ::operator[](&local_b0,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)(local_110 + 0x18),(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pEVar15 = Halfedge::edge(pHVar6);
    pEVar15->_M_node = pvVar14->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           *)(local_110 + 0x18),(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    operator[](&local_b0,(long)local_17c);
    pEVar16 = std::_List_iterator<CMU462::Edge>::operator->
                        ((_List_iterator<CMU462::Edge> *)0x247517);
    pHVar5 = Edge::halfedge(pEVar16);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           *)(local_110 + 0x18),(long)iVar17);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[](&local_50,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pHVar5 = Halfedge::next(pHVar6);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[](&local_128,(long)iVar18);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)(local_110 + 0x18),(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pHVar5 = Halfedge::next(pHVar6);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           *)(local_110 + 0x30),(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[](&local_128,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pHVar5 = Halfedge::next(pHVar6);
    pHVar5->_M_node = pvVar9->_M_node;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[](&local_50,(long)local_17c);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)(local_110 + 0x30),(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pHVar5 = Halfedge::next(pHVar6);
    pHVar5->_M_node = pvVar9->_M_node;
    in_stack_fffffffffffffc50 = (Face *)local_110;
    pvVar9 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                           *)in_stack_fffffffffffffc50,(long)iVar17);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  *)in_stack_fffffffffffffc50,(long)local_17c);
    pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffc40);
    pHVar5 = Halfedge::next(pHVar6);
    pHVar5->_M_node = pvVar9->_M_node;
  }
  pvVar9 = std::
           vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                         *)local_110,0);
  pFVar4 = std::_List_iterator<CMU462::Face>::operator->((_List_iterator<CMU462::Face> *)pvVar9);
  pHVar5 = Face::halfedge(pFVar4);
  pHVar5->_M_node = pvVar9->_M_node;
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)in_stack_fffffffffffffc50);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)in_stack_fffffffffffffc50);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)in_stack_fffffffffffffc50);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)in_stack_fffffffffffffc50);
  std::
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
             *)in_stack_fffffffffffffc50);
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  ~vector((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
           *)in_stack_fffffffffffffc50);
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  ~vector((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
           *)in_stack_fffffffffffffc50);
  std::
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
  ~vector((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
           *)in_stack_fffffffffffffc50);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)in_stack_fffffffffffffc50);
  std::
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
             *)in_stack_fffffffffffffc50);
  return (FaceIter)local_8;
}

Assistant:

FaceIter HalfedgeMesh::bevelFace(FaceIter f) {
	// TODO This method should replace the face f with an additional, inset face
	// (and ring of faces around it), corresponding to a bevel operation. It
	// should return the new face.  NOTE: This method is responsible for updating
	// the *connectivity* of the mesh only---it does not need to update the vertex
	// positions.  These positions will be updated in
	// HalfedgeMesh::bevelFaceComputeNewPositions (which you also have to
	// implement!)

	int n = f->degree();
	vector<VertexIter> old_vertex;
	vector<HalfedgeIter> old_halfedge;
	HalfedgeIter h = f->halfedge();
	do {
		old_vertex.push_back(h->vertex());
		old_halfedge.push_back(h);
		h = h->next();
	} while (h != f->halfedge());

	FaceIter new_face = f;
	vector<FaceIter> sideFace;
	vector<EdgeIter> innerEdge;
	vector<EdgeIter> connectingEdge;
	vector<VertexIter> new_vertex;
	vector<HalfedgeIter> outward_halfedge;
	vector<HalfedgeIter> inward_halfedge;
	vector<HalfedgeIter> inside_halfedge;
	vector<HalfedgeIter> inside_twin_halfedge;

	for (int i = 0; i < n; i++) {
		sideFace.push_back(newFace());
		innerEdge.push_back(newEdge());
		connectingEdge.push_back(newEdge());
		new_vertex.push_back(newVertex());
		outward_halfedge.push_back(newHalfedge());
		inward_halfedge.push_back(newHalfedge());
		inside_halfedge.push_back(newHalfedge());
		inside_twin_halfedge.push_back(newHalfedge());
	}

	int i_plus_1, i_minus_1;
	for (int i = 0; i < n; i++) {
		i_plus_1 = (i + 1) % n;
		i_minus_1 = (i - 1 + n) % n;

		new_vertex[i]->position = old_vertex[i]->position;

		old_vertex[i]->halfedge() = inward_halfedge[i];
		inward_halfedge[i]->vertex() = old_vertex[i];
		new_vertex[i]->halfedge() = outward_halfedge[i];
		outward_halfedge[i]->vertex() = new_vertex[i];
		inside_twin_halfedge[i]->vertex() = new_vertex[i_plus_1];
		inside_halfedge[i]->vertex() = new_vertex[i];

		outward_halfedge[i]->twin() = inward_halfedge[i];
		inward_halfedge[i]->twin() = outward_halfedge[i];
		inside_halfedge[i]->twin() = inside_twin_halfedge[i];
		inside_twin_halfedge[i]->twin() = inside_halfedge[i];
		
		outward_halfedge[i]->face() = sideFace[i];
		inward_halfedge[i]->face() = sideFace[i_minus_1];
		inside_twin_halfedge[i]->face() = sideFace[i];
		old_halfedge[i]->face() = sideFace[i];
		sideFace[i]->halfedge() = old_halfedge[i];
		inside_halfedge[i]->face() = new_face;
		
		inside_halfedge[i]->edge() = innerEdge[i];
		inside_twin_halfedge[i]->edge() = innerEdge[i];
		innerEdge[i]->halfedge() = inside_halfedge[i];

		outward_halfedge[i]->edge() = connectingEdge[i];
		inward_halfedge[i]->edge() = connectingEdge[i];
		connectingEdge[i]->halfedge() = inward_halfedge[i];

		old_halfedge[i]->next() = inward_halfedge[i_plus_1];
		inward_halfedge[i]->next() = inside_twin_halfedge[i_minus_1];
		inside_twin_halfedge[i]->next() = outward_halfedge[i];
		outward_halfedge[i]->next() = old_halfedge[i];
		inside_halfedge[i]->next() = inside_halfedge[i_plus_1];
	}
	new_face->halfedge() = inside_halfedge[0];
	//showError("bevelFace() not implemented.");
	return new_face;
}